

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::deinit(LayeredRenderCase *this)

{
  ShaderProgram *pSVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  LayeredRenderCase *this_local;
  
  if (this->m_texture != 0) {
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x480))(1,&this->m_texture);
    this->m_texture = 0;
  }
  if (this->m_fbo != 0) {
    pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  pSVar1 = this->m_renderShader;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
    operator_delete(pSVar1,0xd0);
  }
  pSVar1 = this->m_samplerShader;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
    operator_delete(pSVar1,0xd0);
  }
  this->m_renderShader = (ShaderProgram *)0x0;
  this->m_samplerShader = (ShaderProgram *)0x0;
  return;
}

Assistant:

void LayeredRenderCase::deinit (void)
{
	if (m_texture)
	{
		m_context.getRenderContext().getFunctions().deleteTextures(1, &m_texture);
		m_texture = 0;
	}

	if (m_fbo)
	{
		m_context.getRenderContext().getFunctions().deleteFramebuffers(1, &m_fbo);
		m_fbo = 0;
	}

	delete m_renderShader;
	delete m_samplerShader;

	m_renderShader = DE_NULL;
	m_samplerShader = DE_NULL;
}